

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8272.cpp
# Opt level: O2

void __thiscall Intel::i8272::i8272::run_for(i8272 *this,Cycles cycles)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Drive *pDVar4;
  long lVar5;
  int c;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  IntType IVar11;
  Drive *pDVar12;
  Logger<(Log::Source)13> local_38 [8];
  
  Storage::Disk::Controller::run_for((Controller *)this,cycles);
  if (this->is_sleeping_ == false) {
    lVar3 = this->delay_time_;
    if (0 < lVar3) {
      if (lVar3 - (long)cycles.super_WrappedInt<Cycles>.length_ == 0 ||
          lVar3 < (long)cycles.super_WrappedInt<Cycles>.length_) {
        this->delay_time_ = 0;
        posit_event(this,0x10);
      }
      else {
        this->delay_time_ = lVar3 - (long)cycles.super_WrappedInt<Cycles>.length_;
      }
    }
    iVar2 = this->drives_seeking_;
    if (iVar2 != 0) {
      for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
        if (this->drives_[uVar7].phase == Seeking) {
          pDVar12 = this->drives_ + uVar7;
          lVar3 = pDVar12->step_rate_counter + (long)cycles.super_WrappedInt<Cycles>.length_;
          lVar5 = (long)this->step_rate_time_ * 8000;
          pDVar12->step_rate_counter = lVar3 % lVar5;
          lVar3 = lVar3 / lVar5 + 1;
          do {
            lVar3 = lVar3 + -1;
            if (lVar3 == 0) goto LAB_0017b514;
            bVar1 = (int)(uint)pDVar12->head_position <= pDVar12->target_head_position;
            Log::Logger<(Log::Source)13>::info(local_38);
            Log::Logger<(Log::Source)13>::LogLine::append
                      ((LogLine *)local_38,"Target %d versus believed %d",
                       (ulong)(uint)pDVar12->target_head_position,(ulong)pDVar12->head_position);
            Log::Logger<(Log::Source)13>::LogLine::~LogLine((LogLine *)local_38);
            (*(this->super_MFMController).super_Controller.super_Source._vptr_Source[8])
                      (this,uVar7 & 0xffffffff);
            pDVar4 = Storage::Disk::Controller::get_drive((Controller *)this);
            Storage::Disk::Drive::step(pDVar4,(HeadPosition)((uint)bVar1 * 8 + -4));
            if (-1 < pDVar12->target_head_position) {
              pDVar12->head_position = pDVar12->head_position + bVar1 * '\x02' + -1;
            }
            bVar1 = seek_is_satisfied(this,(int)uVar7);
          } while (!bVar1);
          pDVar12->phase = CompletedSeeking;
          this->drives_seeking_ = this->drives_seeking_ + -1;
LAB_0017b514:
          iVar2 = iVar2 + -1;
          if (iVar2 == 0) break;
        }
      }
    }
    iVar2 = this->head_timers_running_;
    if (iVar2 != 0) {
      iVar8 = iVar2;
      for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
        uVar10 = uVar6 >> 1;
        uVar9 = uVar6 & 1;
        lVar3 = this->drives_[uVar10].head_unload_delay[uVar9];
        if (0 < lVar3) {
          IVar11 = lVar3 - (long)cycles.super_WrappedInt<Cycles>.length_;
          if (IVar11 == 0 || lVar3 < (long)cycles.super_WrappedInt<Cycles>.length_) {
            this->drives_[uVar10].head_is_loaded[uVar9] = false;
            iVar2 = iVar2 + -1;
            this->head_timers_running_ = iVar2;
            IVar11 = 0;
          }
          this->drives_[uVar10].head_unload_delay[uVar9] = IVar11;
          iVar8 = iVar8 + -1;
          if (iVar8 == 0) break;
        }
      }
    }
    if (this->is_executing_ == true) {
      pDVar4 = Storage::Disk::Controller::get_drive((Controller *)this);
      bVar1 = Storage::Disk::Drive::get_is_ready(pDVar4);
      if (!bVar1) {
        posit_event(this,0x40);
      }
    }
    if ((this->delay_time_ == 0) && (this->drives_seeking_ == 0)) {
      bVar1 = this->head_timers_running_ == 0;
      this->is_sleeping_ = bVar1;
      if (bVar1) {
        ClockingHint::Source::update_clocking_observer((Source *)this);
      }
    }
    else {
      this->is_sleeping_ = false;
    }
  }
  return;
}

Assistant:

void i8272::run_for(Cycles cycles) {
	Storage::Disk::MFMController::run_for(cycles);

	if(is_sleeping_) return;

	// check for an expired timer
	if(delay_time_ > 0) {
		if(cycles.as_integral() >= delay_time_) {
			delay_time_ = 0;
			posit_event(int(Event8272::Timer));
		} else {
			delay_time_ -= cycles.as_integral();
		}
	}

	// update seek status of any drives presently seeking
	if(drives_seeking_) {
		int drives_left = drives_seeking_;
		for(int c = 0; c < 4; c++) {
			if(drives_[c].phase == Drive::Seeking) {
				drives_[c].step_rate_counter += cycles.as_integral();
				auto steps = drives_[c].step_rate_counter / (8000 * step_rate_time_);
				drives_[c].step_rate_counter %= (8000 * step_rate_time_);
				while(steps--) {
					// Perform a step.
					int direction = (drives_[c].target_head_position < drives_[c].head_position) ? -1 : 1;
					logger.info().append("Target %d versus believed %d", drives_[c].target_head_position, drives_[c].head_position);
					select_drive(c);
					get_drive().step(Storage::Disk::HeadPosition(direction));
					if(drives_[c].target_head_position >= 0) drives_[c].head_position += direction;

					// Check for completion.
					if(seek_is_satisfied(c)) {
						drives_[c].phase = Drive::CompletedSeeking;
						drives_seeking_--;
						break;
					}
				}

				drives_left--;
				if(!drives_left) break;
			}
		}
	}

	// check for any head unloads
	if(head_timers_running_) {
		int timers_left = head_timers_running_;
		for(int c = 0; c < 8; c++) {
			int drive = (c >> 1);
			int head = c&1;

			if(drives_[drive].head_unload_delay[head] > 0) {
				if(cycles.as_integral() >= drives_[drive].head_unload_delay[head]) {
					drives_[drive].head_unload_delay[head] = 0;
					drives_[drive].head_is_loaded[head] = false;
					head_timers_running_--;
				} else {
					drives_[drive].head_unload_delay[head] -= cycles.as_integral();
				}
				timers_left--;
				if(!timers_left) break;
			}
		}
	}

	// check for busy plus ready disabled
	if(is_executing_ && !get_drive().get_is_ready()) {
		posit_event(int(Event8272::NoLongerReady));
	}

	is_sleeping_ = !delay_time_ && !drives_seeking_ && !head_timers_running_;
	if(is_sleeping_) update_clocking_observer();
}